

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O0

stbtt__buf stbtt__get_subr(stbtt__buf idx,int n)

{
  stbtt__buf b;
  int iVar1;
  int local_34;
  int bias;
  int count;
  int n_local;
  stbtt__buf idx_local;
  
  idx_local.data = idx._8_8_;
  _count = idx.data;
  iVar1 = stbtt__cff_index_count((stbtt__buf *)&count);
  local_34 = 0x6b;
  if (iVar1 < 0x846c) {
    if (0x4d7 < iVar1) {
      local_34 = 0x46b;
    }
  }
  else {
    local_34 = 0x8000;
  }
  local_34 = local_34 + n;
  if ((local_34 < 0) || (iVar1 <= local_34)) {
    join_0x00000010_0x00000000_ = stbtt__new_buf((void *)0x0,0);
  }
  else {
    b._8_8_ = idx_local.data;
    b.data = _count;
    join_0x00000010_0x00000000_ = stbtt__cff_index_get(b,local_34);
  }
  return stack0xffffffffffffffe8;
}

Assistant:

static stbtt__buf stbtt__get_subr(stbtt__buf idx, int n)
{
   int count = stbtt__cff_index_count(&idx);
   int bias = 107;
   if (count >= 33900)
      bias = 32768;
   else if (count >= 1240)
      bias = 1131;
   n += bias;
   if (n < 0 || n >= count)
      return stbtt__new_buf(NULL, 0);
   return stbtt__cff_index_get(idx, n);
}